

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

void __thiscall cmDepends::~cmDepends(cmDepends *this)

{
  this->_vptr_cmDepends = (_func_int **)&PTR__cmDepends_00674870;
  if (this->Dependee != (char *)0x0) {
    operator_delete__(this->Dependee);
  }
  if (this->Depender != (char *)0x0) {
    operator_delete__(this->Depender);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->IncludePath);
  std::__cxx11::string::~string((string *)&this->TargetDirectory);
  std::__cxx11::string::~string((string *)&this->Language);
  std::__cxx11::string::~string((string *)&this->CompileDirectory);
  return;
}

Assistant:

cmDepends::~cmDepends()
{
  delete [] this->Dependee;
  delete [] this->Depender;
}